

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_accepted(ACCEPTED_HANDLE accepted)

{
  ACCEPTED_INSTANCE *accepted_instance;
  AMQP_VALUE result;
  ACCEPTED_HANDLE accepted_local;
  
  if (accepted == (ACCEPTED_HANDLE)0x0) {
    accepted_instance = (ACCEPTED_INSTANCE *)0x0;
  }
  else {
    accepted_instance = (ACCEPTED_INSTANCE *)amqpvalue_clone(accepted->composite_value);
  }
  return (AMQP_VALUE)accepted_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_accepted(ACCEPTED_HANDLE accepted)
{
    AMQP_VALUE result;

    if (accepted == NULL)
    {
        result = NULL;
    }
    else
    {
        ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)accepted;
        result = amqpvalue_clone(accepted_instance->composite_value);
    }

    return result;
}